

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<128U,_62U,_buffer_layout_dfs>::operator()
          (fill<128U,_62U,_buffer_layout_dfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  unsigned_long *puVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  int iVar4;
  ostream *poVar5;
  unsigned_long *puVar6;
  unsigned_long uVar7;
  unsigned_long *puVar8;
  uchar **ppuVar9;
  long lVar10;
  size_t sVar11;
  size_t n0;
  unsigned_long uVar12;
  fill<128U,_124U,_buffer_layout_dfs> local_5c;
  fill<128U,_125U,_buffer_layout_dfs> local_5b;
  fill<128U,_125U,_buffer_layout_dfs> local_5a;
  fill<128U,_124U,_buffer_layout_dfs> local_59;
  uchar **local_58;
  array<Stream,_128UL> *local_50;
  uchar **local_48;
  DI __d;
  
  local_50 = streams;
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"fill_inner");
  poVar5 = std::operator<<(poVar5,", inner, I=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 0x7c;
  puVar8 = buffer_count->_M_elems + 0x7d;
  local_48 = buffer + 0x62fc;
  local_58 = buffer + 0x62f4;
  n0 = 0;
  lVar10 = 0;
  do {
    uVar7 = *puVar1;
    if (uVar7 == 0) {
      fill<128U,_124U,_buffer_layout_dfs>::operator()(&local_59,local_50,buffer,buffer_count);
      uVar7 = *puVar1;
      if (uVar7 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar5,"left stream drained\n");
        sVar11 = -lVar10;
        lVar10 = -n0;
        uVar7 = *puVar8;
        goto LAB_001df081;
      }
    }
    uVar12 = *puVar8;
    if (uVar12 == 0) {
      fill<128U,_125U,_buffer_layout_dfs>::operator()(&local_5a,local_50,buffer,buffer_count);
      uVar12 = *puVar8;
      if (uVar12 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar5,"right stream drained\n");
        sVar11 = -lVar10;
        lVar10 = -n0;
        uVar7 = *puVar1;
        goto LAB_001df14b;
      }
      uVar7 = *puVar1;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"L:\'");
    ppuVar9 = local_48 + (0x17 - uVar7);
    poVar5 = std::operator<<(poVar5,(char *)*ppuVar9);
    poVar5 = std::operator<<(poVar5,"\', R:\'");
    ppuVar3 = buffer + (0x632a - uVar12);
    poVar5 = std::operator<<(poVar5,(char *)*ppuVar3);
    std::operator<<(poVar5,"\'\n");
    iVar4 = cmp(*ppuVar9,*ppuVar3);
    puVar6 = puVar8;
    if (iVar4 < 1) {
      puVar6 = puVar1;
      ppuVar3 = ppuVar9;
    }
    puVar2 = *ppuVar3;
    *puVar6 = *puVar6 - 1;
    buffer[n0 + 0x62f4] = puVar2;
    check_input(local_58,n0);
    lVar10 = lVar10 + -8;
    n0 = n0 + 1;
  } while (n0 != 8);
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar5,"Done, buffer filled\n");
  buffer_count->_M_elems[0x3e] = 8;
  goto LAB_001df296;
LAB_001df081:
  do {
    if (uVar7 == 0) {
      fill<128U,_125U,_buffer_layout_dfs>::operator()(&local_5b,local_50,buffer,buffer_count);
      uVar7 = *puVar8;
      if (uVar7 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar5,"both streams prematurely drained\n");
        ppuVar9 = (uchar **)((long)local_48 - sVar11);
        memmove(buffer + lVar10 + 0x62fc,local_58,sVar11);
        buffer_count->_M_elems[0x3e] = -lVar10;
        check_input(ppuVar9,-lVar10);
        goto LAB_001df296;
      }
    }
    *(uchar **)((long)buffer + sVar11 + 0x317a0) = buffer[0x632a - uVar7];
    uVar7 = uVar7 - 1;
    *puVar8 = uVar7;
    lVar10 = lVar10 + -1;
    sVar11 = sVar11 + 8;
  } while (sVar11 != 0x40);
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar5,"\tbuffer filled\n");
  buffer_count->_M_elems[0x3e] = 8;
  check_input(local_58,8);
  goto LAB_001df296;
LAB_001df14b:
  do {
    if (uVar7 == 0) {
      fill<128U,_124U,_buffer_layout_dfs>::operator()(&local_5c,local_50,buffer,buffer_count);
      uVar7 = *puVar1;
      if (uVar7 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar5,"both streams prematurely drained\n");
        ppuVar9 = (uchar **)((long)local_48 - sVar11);
        memmove(local_48 + lVar10,local_58,sVar11);
        buffer_count->_M_elems[0x3e] = -lVar10;
        check_input(ppuVar9,-lVar10);
        goto LAB_001df296;
      }
    }
    *(uchar **)((long)local_48 + (sVar11 - 0x40)) = local_48[0x17 - uVar7];
    uVar7 = uVar7 - 1;
    *puVar1 = uVar7;
    lVar10 = lVar10 + -1;
    sVar11 = sVar11 + 8;
  } while (sVar11 != 0x40);
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar5,"buffer filled\n");
  buffer_count->_M_elems[0x3e] = 8;
  check_input(local_58,8);
LAB_001df296:
  anon_func::DI::~DI(&__d);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}